

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall t_php_generator::generate_php_doc(t_php_generator *this,ostream *out,t_field *field)

{
  ostream *poVar1;
  t_type *type;
  stringstream ss;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  if ((field->super_t_doc).has_doc_ == true) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(field->super_t_doc).doc_._M_dataplus._M_p,
                        (field->super_t_doc).doc_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  type = t_type::get_true_type(field->type_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"@var ",5);
  type_to_phpdoc_abi_cxx11_(&local_1e8,this,type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  generate_php_docstring_comment(this,out,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return;
}

Assistant:

void t_php_generator::generate_php_doc(ostream& out, t_field* field) {
  stringstream ss;

  // prepend free-style doc if available
  if (field->has_doc()) {
    ss << field->get_doc() << endl;
  }

  // append @var tag
  t_type* type = get_true_type(field->get_type());
  ss << "@var " << type_to_phpdoc(type) << endl;

  generate_php_docstring_comment(out, ss.str());
}